

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_type.cpp
# Opt level: O3

czstring pstore::http::media_type_from_extension(czstring extension)

{
  char *__s1;
  int iVar1;
  long lVar2;
  difference_type __d;
  ulong uVar3;
  ulong uVar5;
  char *pcVar6;
  undefined1 *puVar7;
  ulong uVar4;
  
  lVar2 = -0xa0;
  puVar7 = (anonymous_namespace)::media_types;
  pcVar6 = ".css";
  do {
    __s1 = *(char **)(&ws_error_category::vtable + lVar2);
    iVar1 = strcmp(__s1,pcVar6);
    if (iVar1 < 0) {
      if (lVar2 != 0) {
        assert_failed("std::is_sorted ( begin, end, [] (media_type_entry const & lhs, media_type_entry const & rhs) noexcept { return std::strcmp (lhs.name, rhs.name) < 0; })"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/http/media_type.cpp"
                      ,0x3a);
      }
      break;
    }
    lVar2 = lVar2 + 0x10;
    pcVar6 = __s1;
  } while (lVar2 != 0);
  uVar4 = 0xb;
  do {
    uVar3 = uVar4 >> 1;
    iVar1 = strcmp(*(char **)((long)puVar7 + uVar3 * 2 * 8),extension);
    uVar5 = uVar3;
    if (iVar1 < 0) {
      uVar5 = ~uVar3 + uVar4;
      puVar7 = (undefined1 *)((long)puVar7 + (uVar3 * 2 + 2) * 8);
    }
    uVar4 = uVar5;
  } while (0 < (long)uVar5);
  pcVar6 = "application/octet-stream";
  if ((puVar7 != &ws_error_category::vtable) &&
     (iVar1 = strcmp(extension,*(char **)puVar7), iVar1 == 0)) {
    pcVar6 = *(char **)((long)puVar7 + 8);
  }
  return pcVar6;
}

Assistant:

gsl::czstring PSTORE_NONNULL
        media_type_from_extension (gsl::czstring const PSTORE_NONNULL extension) {
            static auto const begin = std::begin (media_types);
            static auto const end = std::end (media_types);

            PSTORE_ASSERT (std::is_sorted (
                begin, end,
                [] (media_type_entry const & lhs, media_type_entry const & rhs) noexcept {
                    return std::strcmp (lhs.name, rhs.name) < 0;
                }));

            auto const pos = std::lower_bound (
                begin, end, extension,
                [] (media_type_entry const & mte, gsl::czstring const ext) noexcept {
                    return std::strcmp (mte.name, ext) < 0;
                });
            return pos != end && std::strcmp (extension, pos->name) == 0
                       ? pos->media_type
                       : "application/octet-stream";
        }